

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractWrittenFont.cpp
# Opt level: O2

EStatusCode __thiscall
AbstractWrittenFont::WriteGlyphEncodingInfoState
          (AbstractWrittenFont *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID,
          GlyphEncodingInfo *inGlyphEncodingInfo)

{
  EStatusCode EVar1;
  Trace *this_00;
  DictionaryContext *this_01;
  pointer puVar2;
  allocator<char> local_49;
  string local_48;
  
  EVar1 = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  if (EVar1 == eSuccess) {
    this_01 = ObjectsContext::StartDictionary(inStateWriter);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Type",&local_49);
    DictionaryContext::WriteKey(this_01,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"GlyphEncodingInfo",&local_49);
    DictionaryContext::WriteNameValue(this_01,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"mEncodedCharacter",&local_49);
    DictionaryContext::WriteKey(this_01,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    DictionaryContext::WriteIntegerValue(this_01,(ulong)inGlyphEncodingInfo->mEncodedCharacter);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"mUnicodeCharacters",&local_49);
    DictionaryContext::WriteKey(this_01,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    ObjectsContext::StartArray(inStateWriter);
    for (puVar2 = (inGlyphEncodingInfo->mUnicodeCharacters).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar2 != (inGlyphEncodingInfo->mUnicodeCharacters).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
      ObjectsContext::WriteInteger(inStateWriter,*puVar2,eTokenSeparatorSpace);
    }
    ObjectsContext::EndArray(inStateWriter,eTokenSeparatorEndLine);
    ObjectsContext::EndDictionary(inStateWriter,this_01);
    ObjectsContext::EndIndirectObject(inStateWriter);
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "AbstractWrittenFont::WriteGlyphEncodingInfoState, failed to write object for object ID = %ld"
                      ,inObjectID);
  }
  return EVar1;
}

Assistant:

EStatusCode AbstractWrittenFont::WriteGlyphEncodingInfoState(ObjectsContext* inStateWriter,
													  ObjectIDType inObjectID,
													  const GlyphEncodingInfo& inGlyphEncodingInfo)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);	
	if(status != PDFHummus::eSuccess) {
		TRACE_LOG1("AbstractWrittenFont::WriteGlyphEncodingInfoState, failed to write object for object ID = %ld",inObjectID);
		return status;
	}
	DictionaryContext* glyphEncodingInfoObject = inStateWriter->StartDictionary();

	glyphEncodingInfoObject->WriteKey("Type");
	glyphEncodingInfoObject->WriteNameValue("GlyphEncodingInfo");

	glyphEncodingInfoObject->WriteKey("mEncodedCharacter");
	glyphEncodingInfoObject->WriteIntegerValue(inGlyphEncodingInfo.mEncodedCharacter);

	glyphEncodingInfoObject->WriteKey("mUnicodeCharacters");
	inStateWriter->StartArray();
	
	ULongVector::const_iterator it = inGlyphEncodingInfo.mUnicodeCharacters.begin();
	for(; it != inGlyphEncodingInfo.mUnicodeCharacters.end();++it)
		inStateWriter->WriteInteger(*it);

	inStateWriter->EndArray(eTokenSeparatorEndLine);

	inStateWriter->EndDictionary(glyphEncodingInfoObject);
	inStateWriter->EndIndirectObject();

	return status;
	
}